

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  int iVar2;
  int iVar3;
  xmlCatalogAllow xVar4;
  xmlChar *val;
  size_t sVar5;
  void *pvVar6;
  bool bVar7;
  xmlCatalogAllow allow;
  size_t new_size;
  xmlChar *tmp;
  int local_48;
  int inputid;
  int count;
  xmlParserInputState state;
  xmlChar *target;
  int l;
  int cur;
  size_t maxLength;
  size_t size;
  size_t len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  len = 0;
  size = 0;
  maxLength = 100;
  iVar3 = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar3 = 1000000000;
  }
  _l = (ulong)iVar3;
  local_48 = 0;
  if ((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '?')) {
    iVar3 = ctxt->input->id;
    xVar1 = ctxt->instate;
    ctxt->instate = XML_PARSER_PI;
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    buf = (xmlChar *)ctxt;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    if (((*(int *)(buf + 0x1c4) == 0) &&
        (500 < *(long *)(*(long *)(buf + 0x38) + 0x20) - *(long *)(*(long *)(buf + 0x38) + 0x18)))
       && (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) < 500))
    {
      xmlSHRINK((xmlParserCtxtPtr)buf);
    }
    val = xmlParsePITarget((xmlParserCtxtPtr)buf);
    if (val == (xmlChar *)0x0) {
      xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_STARTED,(char *)0x0);
LAB_001765a8:
      if (*(int *)(buf + 0x110) != -1) {
        *(xmlParserInputState *)(buf + 0x110) = xVar1;
      }
    }
    else if ((**(char **)(*(long *)(buf + 0x38) + 0x20) == '?') &&
            (*(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 1) == '>')) {
      if (iVar3 != *(int *)(*(long *)(buf + 0x38) + 100)) {
        xmlFatalErrMsg((xmlParserCtxtPtr)buf,XML_ERR_ENTITY_BOUNDARY,
                       "PI declaration doesn\'t start and stop in the same entity\n");
      }
      *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + 2;
      *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 2;
      if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\0') {
        xmlParserInputGrow(*(xmlParserInputPtr *)(buf + 0x38),0xfa);
      }
      if (((*(long *)buf != 0) && (*(int *)(buf + 0x14c) == 0)) &&
         (*(long *)(*(long *)buf + 0x98) != 0)) {
        (**(code **)(*(long *)buf + 0x98))(*(undefined8 *)(buf + 8),val,0);
      }
      if (*(int *)(buf + 0x110) != -1) {
        *(xmlParserInputState *)(buf + 0x110) = xVar1;
      }
    }
    else {
      len = (size_t)(*xmlMallocAtomic)(maxLength);
      if ((void *)len == (void *)0x0) {
        xmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
        *(xmlParserInputState *)(buf + 0x110) = xVar1;
      }
      else {
        iVar2 = xmlSkipBlankChars((xmlParserCtxtPtr)buf);
        if (iVar2 == 0) {
          xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_SPACE_REQUIRED,
                            "ParsePI: PI %s space expected\n",val);
        }
        target._4_4_ = xmlCurrentChar((xmlParserCtxtPtr)buf,(int *)&target);
        do {
          if (target._4_4_ < 0x100) {
            if (((8 < target._4_4_) && (target._4_4_ < 0xb)) ||
               ((target._4_4_ == 0xd || (bVar7 = false, 0x1f < target._4_4_)))) {
LAB_0017612c:
              bVar7 = true;
              if (target._4_4_ == 0x3f) {
                bVar7 = *(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 1) != '>';
              }
            }
          }
          else if ((((0xff < target._4_4_) && (target._4_4_ < 0xd800)) ||
                   ((0xdfff < target._4_4_ && (target._4_4_ < 0xfffe)))) ||
                  ((bVar7 = false, 0xffff < target._4_4_ && (bVar7 = false, target._4_4_ < 0x110000)
                   ))) goto LAB_0017612c;
          if (!bVar7) {
            *(undefined1 *)(len + size) = 0;
            if (target._4_4_ == 0x3f) {
              if (iVar3 != *(int *)(*(long *)(buf + 0x38) + 100)) {
                xmlFatalErrMsg((xmlParserCtxtPtr)buf,XML_ERR_ENTITY_BOUNDARY,
                               "PI declaration doesn\'t start and stop in the same entity\n");
              }
              *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + 2;
              *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 2;
              if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\0') {
                xmlParserInputGrow(*(xmlParserInputPtr *)(buf + 0x38),0xfa);
              }
              if ((((xVar1 == XML_PARSER_MISC) || (xVar1 == XML_PARSER_START)) &&
                  (iVar3 = xmlStrEqual(val,(xmlChar *)"oasis-xml-catalog"), iVar3 != 0)) &&
                 ((xVar4 = xmlCatalogGetDefaults(), xVar4 == XML_CATA_ALLOW_DOCUMENT ||
                  (xVar4 == XML_CATA_ALLOW_ALL)))) {
                xmlParseCatalogPI((xmlParserCtxtPtr)buf,(xmlChar *)len);
              }
              if (((*(long *)buf != 0) && (*(int *)(buf + 0x14c) == 0)) &&
                 (*(long *)(*(long *)buf + 0x98) != 0)) {
                (**(code **)(*(long *)buf + 0x98))(*(undefined8 *)(buf + 8),val,len);
              }
            }
            else {
              xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_FINISHED,
                                "ParsePI: PI %s never end ...\n",val);
            }
            (*xmlFree)((void *)len);
            goto LAB_001765a8;
          }
          sVar5 = maxLength;
          pvVar6 = (void *)len;
          if (maxLength <= size + 5) {
            sVar5 = maxLength << 1;
            pvVar6 = (*xmlRealloc)((void *)len,sVar5);
            if (pvVar6 == (void *)0x0) {
              xmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
              (*xmlFree)((void *)len);
              *(xmlParserInputState *)(buf + 0x110) = xVar1;
              return;
            }
          }
          len = (size_t)pvVar6;
          maxLength = sVar5;
          local_48 = local_48 + 1;
          if (0x32 < local_48) {
            if (((*(int *)(buf + 0x1c4) == 0) &&
                (500 < *(long *)(*(long *)(buf + 0x38) + 0x20) -
                       *(long *)(*(long *)(buf + 0x38) + 0x18))) &&
               (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) <
                500)) {
              xmlSHRINK((xmlParserCtxtPtr)buf);
            }
            if ((*(int *)(buf + 0x1c4) == 0) &&
               (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) <
                0xfa)) {
              xmlGROW((xmlParserCtxtPtr)buf);
            }
            if (*(int *)(buf + 0x110) == -1) {
              (*xmlFree)((void *)len);
              return;
            }
            local_48 = 0;
          }
          if ((int)target == 1) {
            *(char *)(len + size) = (char)target._4_4_;
            size = size + 1;
          }
          else {
            iVar2 = xmlCopyCharMultiByte((xmlChar *)(len + size),target._4_4_);
            size = (long)iVar2 + size;
          }
          if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
            *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
            *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
          }
          else {
            *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
          }
          *(long *)(*(long *)(buf + 0x38) + 0x20) =
               *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)(int)target;
          target._4_4_ = xmlCurrentChar((xmlParserCtxtPtr)buf,(int *)&target);
          if (target._4_4_ == 0) {
            if (((*(int *)(buf + 0x1c4) == 0) &&
                (500 < *(long *)(*(long *)(buf + 0x38) + 0x20) -
                       *(long *)(*(long *)(buf + 0x38) + 0x18))) &&
               (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) <
                500)) {
              xmlSHRINK((xmlParserCtxtPtr)buf);
            }
            if ((*(int *)(buf + 0x1c4) == 0) &&
               (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) <
                0xfa)) {
              xmlGROW((xmlParserCtxtPtr)buf);
            }
            target._4_4_ = xmlCurrentChar((xmlParserCtxtPtr)buf,(int *)&target);
          }
        } while (size <= _l);
        xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_FINISHED,"PI %s too big found",val);
        (*xmlFree)((void *)len);
        *(xmlParserInputState *)(buf + 0x110) = xVar1;
      }
    }
  }
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if ((RAW == '<') && (NXT(1) == '?')) {
	int inputid = ctxt->input->id;
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		if (ctxt->instate != XML_PARSER_EOF)
		    ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size);
	    if (buf == NULL) {
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = CUR_CHAR(l);
	    while (IS_CHAR(cur) && /* checked */
		   ((cur != '?') || (NXT(1) != '>'))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    size_t new_size = size * 2;
		    tmp = (xmlChar *) xmlRealloc(buf, new_size);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
                    size = new_size;
		}
		count++;
		if (count > 50) {
		    SHRINK;
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buf);
                        return;
                    }
		    count = 0;
		}
		COPY_BUF(l,buf,len,cur);
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
                if (len > maxLength) {
                    xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                      "PI %s too big found", target);
                    xmlFree(buf);
                    ctxt->instate = state;
                    return;
                }
	    }
	    buf[len] = 0;
	    if (cur != '?') {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if (((state == XML_PARSER_MISC) ||
	             (state == XML_PARSER_START)) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();
		    if ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			(allow == XML_CATA_ALLOW_ALL))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif


		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF)
	    ctxt->instate = state;
    }
}